

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_variance_sse2.c
# Opt level: O2

void highbd_8_variance_sse2
               (uint16_t *src,int src_stride,uint16_t *ref,int ref_stride,int w,int h,uint32_t *sse,
               int *sum,high_variance_fn_t var_fn,int block_size)

{
  long lVar1;
  long lVar2;
  int local_70;
  uint32_t local_6c;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  uint16_t *local_48;
  uint16_t *local_40;
  long local_38;
  
  *sse = 0;
  lVar2 = (long)block_size;
  *sum = 0;
  local_38 = (long)w;
  local_58 = (long)h;
  local_68 = src_stride * lVar2 * 2;
  local_60 = ref_stride * lVar2 * 2;
  for (local_50 = 0; local_50 < local_58; local_50 = local_50 + lVar2) {
    local_48 = src;
    local_40 = ref;
    for (lVar1 = 0; lVar1 < local_38; lVar1 = lVar1 + lVar2) {
      (*var_fn)(src,src_stride,ref,ref_stride,&local_6c,&local_70);
      *sse = *sse + local_6c;
      *sum = *sum + local_70;
      src = src + lVar2;
      ref = ref + lVar2;
    }
    src = (uint16_t *)((long)local_48 + local_68);
    ref = (uint16_t *)((long)local_40 + local_60);
  }
  return;
}

Assistant:

static void highbd_8_variance_sse2(const uint16_t *src, int src_stride,
                                   const uint16_t *ref, int ref_stride, int w,
                                   int h, uint32_t *sse, int *sum,
                                   high_variance_fn_t var_fn, int block_size) {
  int i, j;

  *sse = 0;
  *sum = 0;

  for (i = 0; i < h; i += block_size) {
    for (j = 0; j < w; j += block_size) {
      unsigned int sse0;
      int sum0;
      var_fn(src + src_stride * i + j, src_stride, ref + ref_stride * i + j,
             ref_stride, &sse0, &sum0);
      *sse += sse0;
      *sum += sum0;
    }
  }
}